

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  atomic_int *paVar1;
  _Rb_tree_header *p_Var2;
  TPZReference *pTVar3;
  long *plVar4;
  long lVar5;
  ostream *poVar6;
  mapped_type_conflict *pmVar7;
  mapped_type_conflict mVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  long lVar11;
  stringstream sout;
  long local_1b8 [2];
  ostream local_1a8 [376];
  
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).super_TPZGeoEl =
       &PTR__TPZSavable_0189e188;
  TPZGeoElRefLess<pzgeom::TPZQuadTorus>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>,&PTR_PTR_0189da78,DestMesh,
             &cp->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>,gl2lcNdMap,gl2lcElMap);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_0189d778;
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  pTVar3 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_1b8[0] = 0;
  TPZVec<long>::Resize(&this->fSubEl,(cp->fSubEl).fNElements,local_1b8);
  if (0 < (cp->fSubEl).fNElements) {
    p_Var2 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
    lVar11 = 0;
    do {
      plVar4 = (cp->fSubEl).fStore;
      lVar5 = plVar4[lVar11];
      if (lVar5 == -1) {
        mVar8 = -1;
      }
      else {
        p_Var9 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var2->_M_header;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_00f02336:
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ERROR in - ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern(TPZGeoMesh &, const TPZGeoElRefPattern<TGeo> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TGeo = pzgeom::TPZQuadTorus]"
                     ,0xc6);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," subelement ",0xc);
          poVar6 = (ostream *)std::ostream::operator<<(local_1a8,(int)lVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," index = ",9);
          poVar6 = std::ostream::_M_insert<long>((long)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not in the map.",0x13);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/tpzgeoelrefpattern.h.h"
                     ,0x7a);
        }
        do {
          if (lVar5 <= (long)*(size_t *)(p_Var9 + 1)) {
            p_Var10 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[(long)*(size_t *)(p_Var9 + 1) < lVar5];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 == p_Var2) ||
           (lVar5 < (long)((_Rb_tree_header *)p_Var10)->_M_node_count)) goto LAB_00f02336;
        pmVar7 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](gl2lcElMap,plVar4 + lVar11);
        mVar8 = *pmVar7;
      }
      (this->fSubEl).fStore[lVar11] = mVar8;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (cp->fSubEl).fNElements);
  }
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh,
											 const TPZGeoElRefPattern<TGeo> &cp,
											 std::map<int64_t,int64_t> &gl2lcNdMap,
											 std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp,gl2lcNdMap,gl2lcElMap),
fRefPattern ( cp.fRefPattern )
{
	int i;
    this->fSubEl.Resize(cp.fSubEl.size(),0);
	for (i=0;i<cp.fSubEl.NElements();i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i] = -1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
			std::stringstream sout;
			sout << "ERROR in - " << __PRETTY_FUNCTION__
			<< " subelement " << i << " index = " << cp.fSubEl[i] << " is not in the map.";
#ifdef PZ_LOG
            TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
			LOGPZ_ERROR (loggerrefpattern,sout.str().c_str());
#endif
			DebugStop();
		}
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}